

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long,unsigned_long>
          (OutOfRangeException *this,string *msg,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_RCX;
  unsigned_long in_RDX;
  unsigned_long in_RSI;
  string *in_RDI;
  string local_48 [40];
  
  Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
            (in_RDI,in_RSI,in_RDX,in_RCX);
  duckdb::OutOfRangeException::OutOfRangeException((OutOfRangeException *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}